

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blowfish.c
# Opt level: O0

int mbedtls_blowfish_setkey(mbedtls_blowfish_context *ctx,uchar *key,uint keybits)

{
  uint uVar1;
  uint32_t local_3c;
  uint32_t local_38;
  uint32_t datar;
  uint32_t datal;
  uint32_t data;
  uint k;
  uint j;
  uint i;
  uint keybits_local;
  uchar *key_local;
  mbedtls_blowfish_context *ctx_local;
  
  if (((keybits < 0x20) || (0x1c0 < keybits)) || ((keybits & 7) != 0)) {
    ctx_local._4_4_ = -0x16;
  }
  else {
    j = keybits >> 3;
    for (k = 0; k < 4; k = k + 1) {
      for (data = 0; data < 0x100; data = data + 1) {
        ctx->S[k][data] = S[k][data];
      }
    }
    data = 0;
    for (k = 0; k < 0x12; k = k + 1) {
      datar = 0;
      for (datal = 0; datal < 4; datal = datal + 1) {
        uVar1 = data + 1;
        datar = datar << 8 | (uint)key[data];
        data = uVar1;
        if (j <= uVar1) {
          data = 0;
        }
      }
      ctx->P[k] = P[k] ^ datar;
    }
    local_38 = 0;
    local_3c = 0;
    _i = key;
    key_local = (uchar *)ctx;
    for (k = 0; k < 0x12; k = k + 2) {
      blowfish_enc((mbedtls_blowfish_context *)key_local,&local_38,&local_3c);
      *(uint32_t *)(key_local + (ulong)k * 4) = local_38;
      *(uint32_t *)(key_local + (ulong)(k + 1) * 4) = local_3c;
    }
    for (k = 0; k < 4; k = k + 1) {
      for (data = 0; data < 0x100; data = data + 2) {
        blowfish_enc((mbedtls_blowfish_context *)key_local,&local_38,&local_3c);
        *(uint32_t *)(key_local + (ulong)data * 4 + (ulong)k * 0x400 + 0x48) = local_38;
        *(uint32_t *)(key_local + (ulong)(data + 1) * 4 + (ulong)k * 0x400 + 0x48) = local_3c;
      }
    }
    ctx_local._4_4_ = 0;
  }
  return ctx_local._4_4_;
}

Assistant:

int mbedtls_blowfish_setkey( mbedtls_blowfish_context *ctx,
                             const unsigned char *key,
                             unsigned int keybits )
{
    unsigned int i, j, k;
    uint32_t data, datal, datar;
    BLOWFISH_VALIDATE_RET( ctx != NULL );
    BLOWFISH_VALIDATE_RET( key != NULL );

    if( keybits < MBEDTLS_BLOWFISH_MIN_KEY_BITS    ||
        keybits > MBEDTLS_BLOWFISH_MAX_KEY_BITS    ||
        keybits % 8 != 0 )
    {
        return( MBEDTLS_ERR_BLOWFISH_BAD_INPUT_DATA );
    }

    keybits >>= 3;

    for( i = 0; i < 4; i++ )
    {
        for( j = 0; j < 256; j++ )
            ctx->S[i][j] = S[i][j];
    }

    j = 0;
    for( i = 0; i < MBEDTLS_BLOWFISH_ROUNDS + 2; ++i )
    {
        data = 0x00000000;
        for( k = 0; k < 4; ++k )
        {
            data = ( data << 8 ) | key[j++];
            if( j >= keybits )
                j = 0;
        }
        ctx->P[i] = P[i] ^ data;
    }

    datal = 0x00000000;
    datar = 0x00000000;

    for( i = 0; i < MBEDTLS_BLOWFISH_ROUNDS + 2; i += 2 )
    {
        blowfish_enc( ctx, &datal, &datar );
        ctx->P[i] = datal;
        ctx->P[i + 1] = datar;
    }

    for( i = 0; i < 4; i++ )
    {
       for( j = 0; j < 256; j += 2 )
       {
            blowfish_enc( ctx, &datal, &datar );
            ctx->S[i][j] = datal;
            ctx->S[i][j + 1] = datar;
        }
    }
    return( 0 );
}